

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

int __thiscall bigint<13>::numbits(bigint<13> *this)

{
  ushort local_20;
  int local_1c;
  digit mask;
  digit last;
  int bits;
  bigint<13> *this_local;
  
  if (this->len != 0) {
    local_1c = this->len << 4;
    for (local_20 = 0x8000; local_20 != 0; local_20 = (ushort)((int)(uint)local_20 >> 1)) {
      if ((this->digits[this->len + -1] & local_20) != 0) {
        return local_1c;
      }
      local_1c = local_1c + -1;
    }
  }
  return 0;
}

Assistant:

int numbits() const
    {
        if(!len) return 0;
        int bits = len*BI_DIGIT_BITS;
        digit last = digits[len-1], mask = 1<<(BI_DIGIT_BITS-1);
        while(mask)
        {
            if(last&mask) return bits;
            bits--;
            mask >>= 1;
        }
        return 0;
    }